

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  undefined1 auVar5 [16];
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  undefined8 uVar21;
  new_allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var22;
  ctrl_t *pcVar23;
  size_t sVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  ulong uVar26;
  slot_type *psVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  slot_type *psVar29;
  ulong uVar30;
  byte bVar31;
  size_t i;
  FindInfo FVar32;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> hStack_69;
  new_allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>> *pnStack_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
  pStack_60;
  
  uVar3 = this->capacity_;
  if (uVar3 == 0) {
    resize(this,1);
    return;
  }
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x288,"size_t phmap::priv::CapacityToGrowth(size_t)");
  }
  if (uVar3 - (uVar3 >> 3) >> 1 < this->size_) {
    resize(this,uVar3 * 2 + 1);
    return;
  }
  uVar3 = this->capacity_;
  if ((uVar3 == 0) || ((uVar3 + 1 & uVar3) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::shared_ptr<cs::name_space>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::shared_ptr<cs::name_space>>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::shared_ptr<cs::name_space>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::shared_ptr<cs::name_space>>>]"
                 );
  }
  if (uVar3 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f9,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::shared_ptr<cs::name_space>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::shared_ptr<cs::name_space>>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::shared_ptr<cs::name_space>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::shared_ptr<cs::name_space>>>]"
                 );
  }
  pcVar4 = this->ctrl_;
  if (pcVar4[uVar3] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x270,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar23 = pcVar4 + uVar3;
  if (pcVar23 + 1 != pcVar4) {
    uVar30 = 0;
    do {
      pcVar1 = pcVar4 + uVar30;
      cVar6 = pcVar1[1];
      cVar7 = pcVar1[2];
      cVar8 = pcVar1[3];
      cVar9 = pcVar1[4];
      cVar10 = pcVar1[5];
      cVar11 = pcVar1[6];
      cVar12 = pcVar1[7];
      cVar13 = pcVar1[8];
      cVar14 = pcVar1[9];
      cVar15 = pcVar1[10];
      cVar16 = pcVar1[0xb];
      cVar17 = pcVar1[0xc];
      cVar18 = pcVar1[0xd];
      cVar19 = pcVar1[0xe];
      cVar20 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar4 + uVar30);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar6 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar7 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      uVar30 = uVar30 + 0x10;
    } while (uVar3 + 1 != uVar30);
  }
  uVar21 = *(undefined8 *)(pcVar4 + 8);
  *(undefined8 *)(pcVar23 + 1) = *(undefined8 *)pcVar4;
  *(undefined8 *)(pcVar23 + 9) = uVar21;
  *pcVar23 = -1;
  if (this->capacity_ == 0) {
    i = 0;
  }
  else {
    pnStack_68 = (new_allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>
                  *)&this->settings_;
    i = 0;
    do {
      if (this->ctrl_[i] == -2) {
        sVar24 = std::
                 hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator()(&hStack_69,&this->slots_[i].value.first);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = sVar24;
        uVar30 = SUB168(auVar5 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar5 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar32 = find_first_non_full(this,uVar30);
        sVar24 = FVar32.offset;
        uVar3 = this->capacity_;
        if ((uVar3 + 1 & uVar3) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                        ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar26 = uVar30 >> 7 & uVar3;
        bVar31 = (byte)uVar30;
        if (((i - uVar26 ^ sVar24 - uVar26) & uVar3) < 0x10) {
          bVar31 = bVar31 & 0x7f;
        }
        else {
          if (this->ctrl_[sVar24] == -2) {
            set_ctrl(this,sVar24,bVar31 & 0x7f);
            this_00 = pnStack_68;
            psVar29 = this->slots_ + i;
            paVar25 = &(psVar29->value).first.field_2;
            pStack_60.first._M_dataplus._M_p = (psVar29->value).first._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pStack_60.first._M_dataplus._M_p == paVar25) {
              pStack_60.first.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
              pStack_60.first.field_2._8_8_ =
                   *(undefined8 *)((long)&(psVar29->value).first.field_2 + 8);
              pStack_60.first._M_dataplus._M_p = (pointer)&pStack_60.first.field_2;
            }
            else {
              pStack_60.first.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
            }
            psVar29 = this->slots_ + i;
            pStack_60.first._M_string_length = (psVar29->value).first._M_string_length;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)psVar29 = paVar25;
            (psVar29->key)._M_string_length = 0;
            (psVar29->value).first.field_2._M_local_buf[0] = '\0';
            pStack_60.second.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (psVar29->value).second.
                 super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            pStack_60.second.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (psVar29->value).second.
                 super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            (psVar29->value).second.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (psVar29->value).second.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            __gnu_cxx::
            new_allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>::
            destroy<std::pair<std::__cxx11::string,std::shared_ptr<cs::name_space>>>
                      (pnStack_68,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
                        *)&psVar29->value);
            psVar29 = this->slots_ + sVar24;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
            ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
                    *)&this->slots_[i].value,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
                    *)&psVar29->value);
            __gnu_cxx::
            new_allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>::
            destroy<std::pair<std::__cxx11::string,std::shared_ptr<cs::name_space>>>
                      (this_00,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
                                *)&psVar29->value);
            _Var22._M_pi = pStack_60.second.
                           super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
            psVar29 = this->slots_ + sVar24;
            psVar27 = this->slots_ + sVar24;
            paVar28 = &(psVar27->value).first.field_2;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)psVar27 = paVar28;
            paVar25 = &pStack_60.first.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pStack_60.first._M_dataplus._M_p == paVar25) {
              paVar28->_M_allocated_capacity = pStack_60.first.field_2._M_allocated_capacity;
              *(undefined8 *)((long)&(psVar27->value).first.field_2 + 8) =
                   pStack_60.first.field_2._8_8_;
            }
            else {
              (psVar29->value).first._M_dataplus._M_p = pStack_60.first._M_dataplus._M_p;
              (psVar29->value).first.field_2._M_allocated_capacity =
                   pStack_60.first.field_2._M_allocated_capacity;
            }
            (psVar29->value).first._M_string_length = pStack_60.first._M_string_length;
            pStack_60.first._M_string_length = 0;
            pStack_60.first.field_2._M_allocated_capacity =
                 pStack_60.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
            (psVar29->value).second.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pStack_60.second.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (psVar29->value).second.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = pStack_60.second.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (psVar29->value).second.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = _Var22._M_pi;
            pStack_60.second.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            pStack_60.first._M_dataplus._M_p = (pointer)paVar25;
            __gnu_cxx::
            new_allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>::
            destroy<std::pair<std::__cxx11::string,std::shared_ptr<cs::name_space>>>
                      (pnStack_68,&pStack_60);
            i = i - 1;
            goto LAB_0015ee0a;
          }
          if (this->ctrl_[sVar24] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                          ,0x92b,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::shared_ptr<cs::name_space>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::shared_ptr<cs::name_space>>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::shared_ptr<cs::name_space>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::shared_ptr<cs::name_space>>>]"
                         );
          }
          set_ctrl(this,sVar24,bVar31 & 0x7f);
          psVar29 = this->slots_ + i;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
          ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
                  *)&this->slots_[sVar24].value,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
                  *)&psVar29->value);
          __gnu_cxx::
          new_allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>::
          destroy<std::pair<std::__cxx11::string,std::shared_ptr<cs::name_space>>>
                    (pnStack_68,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
                      *)&psVar29->value);
          bVar31 = 0x80;
        }
        set_ctrl(this,i,bVar31);
      }
LAB_0015ee0a:
      i = i + 1;
    } while (i != this->capacity_);
  }
  reset_growth_left(this,i);
  return;
}

Assistant:

void rehash_and_grow_if_necessary()
			{
				if (capacity_ == 0) {
					resize(1);
				}
				else if (size() <= CapacityToGrowth(capacity()) / 2) {
					// Squash DELETED without growing if there is enough capacity.
					drop_deletes_without_resize();
				}
				else {
					// Otherwise grow the container.
					resize(capacity_ * 2 + 1);
				}
			}